

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlSearchNsSafe(xmlNodePtr node,xmlChar *prefix,xmlNsPtr *out)

{
  xmlDocPtr doc_00;
  xmlChar *pxVar1;
  int iVar2;
  xmlNsPtr pxVar3;
  bool bVar4;
  xmlNodePtr parent;
  xmlNodePtr orig;
  xmlDocPtr doc;
  xmlNsPtr cur;
  xmlNsPtr *out_local;
  xmlChar *prefix_local;
  xmlNodePtr node_local;
  
  if (out == (xmlNsPtr *)0x0) {
    node_local._4_4_ = 1;
  }
  else {
    *out = (xmlNsPtr)0x0;
    if ((node == (xmlNodePtr)0x0) || (node->type == XML_NAMESPACE_DECL)) {
      node_local._4_4_ = 1;
    }
    else {
      doc_00 = node->doc;
      prefix_local = (xmlChar *)node;
      if (((((doc_00 == (xmlDocPtr)0x0) || (prefix == (xmlChar *)0x0)) || (*prefix != 'x')) ||
          ((prefix[1] != 'm' || (prefix[2] != 'l')))) || (prefix[3] != '\0')) {
        do {
          pxVar1 = prefix_local;
          if (*(int *)(prefix_local + 8) == 1) {
            while( true ) {
              bVar4 = false;
              if (prefix_local != (xmlChar *)0x0) {
                bVar4 = *(int *)(prefix_local + 8) == 1;
              }
              if (!bVar4) {
                if (((doc_00 == (xmlDocPtr)0x0) && (prefix != (xmlChar *)0x0)) &&
                   ((*prefix == 'x' &&
                    (((prefix[1] == 'm' && (prefix[2] == 'l')) && (prefix[3] == '\0')))))) {
                  pxVar3 = xmlNewXmlNs();
                  if (pxVar3 == (xmlNsPtr)0x0) {
                    return -1;
                  }
                  pxVar3->next = *(_xmlNs **)(pxVar1 + 0x60);
                  *(xmlNsPtr *)(pxVar1 + 0x60) = pxVar3;
                  *out = pxVar3;
                }
                return 0;
              }
              for (doc = *(xmlDocPtr *)(prefix_local + 0x60); doc != (xmlDocPtr)0x0;
                  doc = (xmlDocPtr)doc->_private) {
                iVar2 = xmlStrEqual((xmlChar *)doc->children,prefix);
                if ((iVar2 != 0) && (doc->name != (char *)0x0)) {
                  *out = (xmlNsPtr)doc;
                  return 0;
                }
              }
              if (((node != (xmlNodePtr)prefix_local) &&
                  (pxVar3 = *(xmlNsPtr *)(prefix_local + 0x48), pxVar3 != (xmlNsPtr)0x0)) &&
                 ((iVar2 = xmlStrEqual(pxVar3->prefix,prefix), iVar2 != 0 &&
                  (pxVar3->href != (xmlChar *)0x0)))) break;
              prefix_local = *(xmlChar **)(prefix_local + 0x28);
            }
            *out = pxVar3;
            return 0;
          }
          prefix_local = *(xmlChar **)(prefix_local + 0x28);
        } while (prefix_local != (xmlChar *)0x0);
        node_local._4_4_ = 0;
      }
      else {
        pxVar3 = xmlTreeEnsureXMLDecl(doc_00);
        if (pxVar3 == (xmlNsPtr)0x0) {
          node_local._4_4_ = -1;
        }
        else {
          *out = pxVar3;
          node_local._4_4_ = 0;
        }
      }
    }
  }
  return node_local._4_4_;
}

Assistant:

int
xmlSearchNsSafe(xmlNodePtr node, const xmlChar *prefix,
                xmlNsPtr *out) {
    xmlNsPtr cur;
    xmlDocPtr doc;
    xmlNodePtr orig = node;
    xmlNodePtr parent;

    if (out == NULL)
        return(1);
    *out = NULL;
    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL))
        return(1);

    doc = node->doc;

    if ((doc != NULL) && (IS_STR_XML(prefix))) {
        cur = xmlTreeEnsureXMLDecl(doc);
        if (cur == NULL)
            return(-1);
        *out = cur;
        return(0);
    }

    while (node->type != XML_ELEMENT_NODE) {
        node = node->parent;
        if (node == NULL)
            return(0);
    }

    parent = node;

    while ((node != NULL) && (node->type == XML_ELEMENT_NODE)) {
        cur = node->nsDef;
        while (cur != NULL) {
            if ((xmlStrEqual(cur->prefix, prefix)) &&
                (cur->href != NULL)) {
                *out = cur;
                return(0);
            }
            cur = cur->next;
        }
        if (orig != node) {
            cur = node->ns;
            if ((cur != NULL) &&
                (xmlStrEqual(cur->prefix, prefix)) &&
                (cur->href != NULL)) {
                *out = cur;
                return(0);
            }
        }

	node = node->parent;
    }

    /*
     * The XML-1.0 namespace is normally held on the document
     * element. In this case exceptionally create it on the
     * node element.
     */
    if ((doc == NULL) && (IS_STR_XML(prefix))) {
        cur = xmlNewXmlNs();
        if (cur == NULL)
            return(-1);
        cur->next = parent->nsDef;
        parent->nsDef = cur;
        *out = cur;
    }

    return(0);
}